

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Epnp.cpp
# Opt level: O1

void __thiscall
opengv::absolute_pose::modules::Epnp::copy_R_and_t
          (Epnp *this,double (*R_src) [3],double *t_src,double (*R_dst) [3],double *t_dst)

{
  int i;
  long lVar1;
  long lVar2;
  
  lVar1 = 0;
  do {
    lVar2 = 0;
    do {
      (*R_dst)[lVar2] = (*R_src)[lVar2];
      lVar2 = lVar2 + 1;
    } while (lVar2 != 3);
    t_dst[lVar1] = t_src[lVar1];
    lVar1 = lVar1 + 1;
    R_dst = R_dst + 1;
    R_src = R_src + 1;
  } while (lVar1 != 3);
  return;
}

Assistant:

void
opengv::absolute_pose::modules::Epnp::copy_R_and_t(
    const double R_src[3][3],
    const double t_src[3],
    double R_dst[3][3],
    double t_dst[3])
{
  for(int i = 0; i < 3; i++)
  {
    for(int j = 0; j < 3; j++)
      R_dst[i][j] = R_src[i][j];
    t_dst[i] = t_src[i];
  }
}